

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void __thiscall common::Options::Init(Options *this,int argc,char **argv)

{
  int iVar1;
  Log *this_00;
  allocator local_49;
  string local_48 [36];
  int local_24;
  char **ppcStack_20;
  int opt;
  char **argv_local;
  Options *pOStack_10;
  int argc_local;
  Options *this_local;
  
  local_24 = 0;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pOStack_10 = this;
  while (local_24 = getopt(argv_local._4_4_,ppcStack_20,"l:f:c:"), local_24 != -1) {
    if (local_24 == 99) {
      std::__cxx11::string::operator=((string *)&this->config_file,_optarg);
    }
    else if (local_24 == 0x66) {
      std::__cxx11::string::operator=((string *)&this->log_file,_optarg);
    }
    else if (local_24 == 0x6c) {
      iVar1 = xlib::Atoi(_optarg);
      this->log_level = iVar1;
    }
  }
  this_00 = xlib::Log::Instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"optind %v",&local_49);
  xlib::Log::SWrite<int>
            (this_00,LOG_PRIORITY_DEBUG,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/options.cc"
             ,0x3a,"Init",true,(string *)local_48,(int *)&optind);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this->opt_cur = _optind;
  return;
}

Assistant:

void Options::Init(int argc, char **argv) {
    int opt  = 0;
    while ( -1 != (opt = getopt(argc, argv, "l:f:c:")) ) {
        switch (opt) {
            case 'l':
                log_level = xlib::Atoi(optarg);
                break;
            case 'f':
                log_file = optarg;
                break;
            case 'c':
                config_file = optarg;
                break;
        }
    }
    XDBG("optind %v", optind);
    opt_cur = optind;
}